

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O1

void __thiscall
ktx::ValidationContext::
error<unsigned_int&,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
          (ValidationContext *this,IssueError *issue,uint *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3)

{
  char *pcVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar2;
  string_view fmt;
  format_args args_00;
  undefined1 local_c0 [8];
  _Alloc_hider local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  string local_98;
  ulong local_78 [2];
  pointer local_68;
  size_type sStack_60;
  pointer local_58;
  size_type sStack_50;
  pointer local_48;
  size_type sStack_40;
  
  this->numError = this->numError + 1;
  this->returnCode = 3;
  local_c0[0] = (issue->super_Issue).type;
  local_c0._2_2_ = (issue->super_Issue).id;
  pcVar1 = (issue->super_Issue).message._M_str;
  local_b8._M_p = (pointer)&local_a8;
  aVar2 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
           )args_3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,pcVar1,pcVar1 + (issue->super_Issue).message._M_len);
  local_78[0] = (ulong)*args;
  local_68 = (args_1->_M_dataplus)._M_p;
  sStack_60 = args_1->_M_string_length;
  local_58 = (args_2->_M_dataplus)._M_p;
  sStack_50 = args_2->_M_string_length;
  local_48 = (args_3->_M_dataplus)._M_p;
  sStack_40 = args_3->_M_string_length;
  fmt.size_ = 0xddd2;
  fmt.data_ = (char *)(issue->super_Issue).detailsFmt._M_len;
  args_00.field_1.values_ = aVar2.values_;
  args_00.desc_ = (unsigned_long_long)local_78;
  ::fmt::v10::vformat_abi_cxx11_
            (&local_98,(v10 *)(issue->super_Issue).detailsFmt._M_str,fmt,args_00);
  if ((this->callback).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->callback)._M_invoker)((_Any_data *)&this->callback,(ValidationReport *)local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_p != &local_a8) {
      operator_delete(local_b8._M_p,local_a8._M_allocated_capacity + 1);
    }
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

void error(const IssueError& issue, Args&&... args) {
        ++numError;
        returnCode = +rc::INVALID_FILE;
        callback(ValidationReport{issue.type, issue.id, std::string{issue.message}, fmt::format(issue.detailsFmt, std::forward<Args>(args)...)});
    }